

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O2

EventObject * chatra::derefAsEventObject(Reference ref)

{
  Class *pCVar1;
  Class *pCVar2;
  undefined8 *puVar3;
  
  if (((ref.node)->type == Object) && ((ref.node)->object != (Object *)0x0)) {
    pCVar1 = (Class *)(ref.node)->object[1]._vptr_Object;
    pCVar2 = Async::getClassStatic();
    if (pCVar1 == pCVar2) {
      return (EventObject *)&(ref.node)->object[1].super_Lockable;
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar3 = &PTR__exception_0023dab8;
  *(undefined4 *)(puVar3 + 1) = 0x8c;
  __cxa_throw(puVar3,&RuntimeException::typeinfo,std::exception::~exception);
}

Assistant:

EventObject* derefAsEventObject(Reference ref) {
	if (ref.valueType() != ReferenceValueType::Object || ref.isNull())
		throw RuntimeException(StringId::IllegalArgumentException);

	auto* cl = ref.deref<ObjectBase>().getClass();
	EventObject* ret = nullptr;
	if (cl == Async::getClassStatic())
		ret = &ref.deref<Async>();

	if (ret != nullptr)
		return ret;

	throw RuntimeException(StringId::IllegalArgumentException);
}